

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TestContext *pTVar3;
  int iVar4;
  GetBooleanVerifier *pGVar5;
  undefined4 extraout_var;
  GetIntegerVerifier *pGVar6;
  undefined4 extraout_var_00;
  GetFloatVerifier *pGVar7;
  undefined4 extraout_var_01;
  ApiCase *pAVar8;
  long *plVar9;
  long lVar10;
  Context *pCVar11;
  TestNode *pTVar12;
  long *extraout_RAX;
  long *plVar13;
  int _verifierNdx;
  long lVar14;
  IntegerStateQueryTests *pIVar15;
  StateVerifier *normalVerifiers [3];
  StateVerifier *implementationLimitVerifiers [2];
  long *local_108;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  IntegerStateQueryTests *local_c8;
  Context *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  GetBooleanVerifier *local_98;
  GetIntegerVerifier *local_90;
  GetFloatVerifier *local_88;
  long *local_78 [2];
  long local_68 [2];
  TestContext *local_58;
  long local_50;
  GetBooleanVerifier *local_48;
  GetFloatVerifier *local_40;
  
  pGVar5 = (GetBooleanVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar5->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar5->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar5->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar5->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0216a280;
  this->m_verifierBoolean = pGVar5;
  pGVar6 = (GetIntegerVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar6->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar6->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar6->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar6->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0216a2e0;
  this->m_verifierInteger = pGVar6;
  pGVar7 = (GetFloatVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar7->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar7->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar7->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar7->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0216a340;
  this->m_verifierFloat = pGVar7;
  local_48 = this->m_verifierBoolean;
  local_40 = pGVar7;
  local_98 = this->m_verifierBoolean;
  local_90 = this->m_verifierInteger;
  local_88 = pGVar7;
  lVar10 = 0;
  local_c8 = this;
  do {
    lVar14 = 0;
    local_50 = lVar10;
    do {
      local_108 = &local_f8;
      pTVar3 = (TestContext *)(&local_48)[lVar14];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      local_c0 = (local_c8->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,(&PTR_anon_var_dwarf_1eae7a1_0216a3d0)[lVar10 * 3],
                 (allocator<char> *)&local_b8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = (&DAT_0216a3e0)[lVar10 * 6];
      uVar2 = (&DAT_0216a3e4)[lVar10 * 6];
      local_58 = pTVar3;
      ApiCase::ApiCase(pAVar8,local_c0,(char *)local_108,
                       (&PTR_anon_var_dwarf_1f07e12_0216a3d8)[lVar10 * 3]);
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216a688;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      *(undefined4 *)
       ((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar2;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = local_58;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
    lVar10 = local_50 + 1;
  } while (lVar10 != 0xb);
  lVar10 = 0;
  do {
    pGVar5 = (&local_48)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sample_buffers","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"SAMPLE_BUFFERS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a6e0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"samples","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"SAMPLES");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a738;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pTVar3 = (TestContext *)(&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"generate_mipmap_hint","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"GENERATE_MIPMAP_HINT");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a790;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8192;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"depth_func","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"DEPTH_FUNC");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a7e8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"cull_face_mode","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"CULL_FACE_MODE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a840;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"front_face_mode","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"FRONT_FACE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a898;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"viewport","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"VIEWPORT");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a8f0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"scissor_box","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"SCISSOR_BOX");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a948;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"max_viewport_dims","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"MAX_VIEWPORT_DIMS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a9a0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"buffer_component_size","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"x BITS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216a9f8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_ref","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_REF");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216aa50;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb97;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_back_ref","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_REF");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216aa50;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca3;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_ref_separate","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_REF (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216aaa8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b97;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_ref_separate_both","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_REF (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216aaa8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b97;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_ref_separate","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_REF (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216aaa8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca3;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_ref_separate_both","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_REF (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216aaa8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca3;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  pCVar11 = (Context *)0x0;
  pIVar15 = local_c8;
  do {
    local_c0 = (Context *)(&DAT_0216a4e0 + (long)pCVar11 * 5);
    lVar10 = 0;
    local_58 = (TestContext *)pCVar11;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar11 = (pIVar15->super_TestCaseGroup).m_context;
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"stencil_","");
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_d8 = *plVar13;
        lStack_d0 = plVar9[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar13;
        local_e8 = (long *)*plVar9;
      }
      local_108 = &local_f8;
      local_e0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x10);
      ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,*(char **)((long)local_c0 + 8));
      pIVar15 = local_c8;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216ab00;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar11 = (pIVar15->super_TestCaseGroup).m_context;
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"stencil_back_","");
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_d8 = *plVar13;
        lStack_d0 = plVar9[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar13;
        local_e8 = (long *)*plVar9;
      }
      local_108 = &local_f8;
      local_e0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x20);
      ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,*(char **)((long)local_c0 + 0x18));
      pIVar15 = local_c8;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216ab00;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar11 = (pIVar15->super_TestCaseGroup).m_context;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"stencil_","");
      plVar9 = (long *)std::__cxx11::string::append((char *)local_78);
      local_b8 = &local_a8;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_a8 = *plVar13;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar13;
        local_b8 = (long *)*plVar9;
      }
      local_108 = &local_f8;
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_d8 = *plVar13;
        lStack_d0 = plVar9[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar13;
        local_e8 = (long *)*plVar9;
      }
      local_e0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x10);
      ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,*(char **)((long)local_c0 + 8));
      pIVar15 = local_c8;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216ab60;
      *(undefined4 *)((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x408;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar11 = (pIVar15->super_TestCaseGroup).m_context;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"stencil_back_","");
      plVar9 = (long *)std::__cxx11::string::append((char *)local_78);
      local_b8 = &local_a8;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_a8 = *plVar13;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar13;
        local_b8 = (long *)*plVar9;
      }
      local_108 = &local_f8;
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_d8 = *plVar13;
        lStack_d0 = plVar9[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar13;
        local_e8 = (long *)*plVar9;
      }
      local_e0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x20);
      ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,*(char **)((long)local_c0 + 0x18));
      pIVar15 = local_c8;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216ab60;
      *(undefined4 *)((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x408;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar11 = (pIVar15->super_TestCaseGroup).m_context;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"stencil_","");
      plVar9 = (long *)std::__cxx11::string::append((char *)local_78);
      local_b8 = &local_a8;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_a8 = *plVar13;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar13;
        local_b8 = (long *)*plVar9;
      }
      local_108 = &local_f8;
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_d8 = *plVar13;
        lStack_d0 = plVar9[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar13;
        local_e8 = (long *)*plVar9;
      }
      local_e0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x10);
      ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,*(char **)((long)local_c0 + 8));
      pIVar15 = local_c8;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216ab60;
      *(undefined4 *)((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x404;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar11 = (pIVar15->super_TestCaseGroup).m_context;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"stencil_back_","");
      plVar9 = (long *)std::__cxx11::string::append((char *)local_78);
      local_b8 = &local_a8;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_a8 = *plVar13;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar13;
        local_b8 = (long *)*plVar9;
      }
      local_108 = &local_f8;
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_d8 = *plVar13;
        lStack_d0 = plVar9[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar13;
        local_e8 = (long *)*plVar9;
      }
      local_e0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x20);
      ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,*(char **)((long)local_c0 + 0x18));
      pIVar15 = local_c8;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216ab60;
      *(undefined4 *)((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x405;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    pCVar11 = (Context *)((long)&local_58->m_platform + 1);
  } while (pCVar11 != (Context *)0x3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_func","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_FUNC");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216abc0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_func_separate","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_FUNC (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ac18;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b92;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_func_separate_both","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_FUNC (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ac18;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b92;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_func_separate","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_FUNC (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ac18;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008800;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_func_separate_both","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_FUNC (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ac18;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008800;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_value_mask","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_VALUE_MASK");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ac70;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb93;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_value_mask","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_VALUE_MASK");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ac70;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca4;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_value_mask_separate","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_VALUE_MASK (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216acc8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b93;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_value_mask_separate_both","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_VALUE_MASK (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216acc8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b93;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_value_mask_separate","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_VALUE_MASK (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216acc8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca4;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_value_mask_separate_both","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_VALUE_MASK (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216acc8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca4;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_writemask","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_WRITEMASK");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ad20;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb98;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_back_writemask","")
    ;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_WRITEMASK");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ad20;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_writemask_separate","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_WRITEMASK (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ad78;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b98;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_writemask_separate_both","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_WRITEMASK (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ad78;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b98;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_writemask_separate","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_WRITEMASK (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ad78;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stencil_back_writemask_separate_both","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_BACK_WRITEMASK (separate)");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216ad78;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"unpack_alignment","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"UNPACK_ALIGNMENT");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216add0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xcf5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa8);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"pack_alignment","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"PACK_ALIGNMENT");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216add0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xd05;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_50 = 0;
  pIVar15 = local_c8;
  do {
    local_c0 = (Context *)(&PTR_anon_var_dwarf_1f08383_0216a560 + local_50 * 3);
    lVar10 = 0;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar11 = (pIVar15->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,*(char **)local_c0,(allocator<char> *)&local_b8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_108 = &local_f8;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x10);
      uVar2 = *(undefined4 *)((long)local_c0 + 0x14);
      ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,*(undefined **)((long)local_c0 + 8));
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216ae28;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           uVar2;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      pIVar15 = local_c8;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      local_58 = (TestContext *)(pIVar15->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,*(char **)local_c0,(allocator<char> *)local_78);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_d8 = *plVar13;
        lStack_d0 = plVar9[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar13;
        local_e8 = (long *)*plVar9;
      }
      local_e0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_108 = &local_f8;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x10);
      uVar2 = *(undefined4 *)((long)local_c0 + 0x14);
      ApiCase::ApiCase(pAVar8,(Context *)local_58,(char *)local_108,
                       *(undefined **)((long)local_c0 + 8));
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           uVar2;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216ae88;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      pIVar15 = local_c8;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_50 = local_50 + 1;
  } while (local_50 != 4);
  lVar10 = 0;
  do {
    local_c0 = (Context *)(&PTR_anon_var_dwarf_1f083dc_0216a5c0 + lVar10 * 3);
    lVar14 = 0;
    local_50 = lVar10;
    do {
      pGVar5 = (&local_98)[lVar14];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar11 = (pIVar15->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,*(char **)local_c0,(allocator<char> *)&local_b8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_108 = &local_f8;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x10);
      uVar2 = *(undefined4 *)((long)local_c0 + 0x14);
      ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,*(undefined **)((long)local_c0 + 8));
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216aee8;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           uVar2;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      pIVar15 = local_c8;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar10 = 0;
    do {
      pGVar5 = (&local_98)[lVar10];
      pAVar8 = (ApiCase *)operator_new(0xa8);
      local_58 = (TestContext *)(pIVar15->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,*(char **)local_c0,(allocator<char> *)local_78);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_d8 = *plVar13;
        lStack_d0 = plVar9[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar13;
        local_e8 = (long *)*plVar9;
      }
      local_e0 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_108 = &local_f8;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_f8 = *plVar13;
        lStack_f0 = plVar9[3];
      }
      else {
        local_f8 = *plVar13;
        local_108 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c0 + 0x10);
      uVar2 = *(undefined4 *)((long)local_c0 + 0x14);
      ApiCase::ApiCase(pAVar8,(Context *)local_58,(char *)local_108,
                       *(undefined **)((long)local_c0 + 8));
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           uVar2;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0216af48;
      tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      pIVar15 = local_c8;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = local_50 + 1;
  } while (local_50 == 0);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xb0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"compressed_texture_formats","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"COMPRESSED_TEXTURE_FORMATS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216afa8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x86a2000086a3
    ;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         0;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xb0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"shader_binary_formats","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"SHADER_BINARY_FORMATS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216afa8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x8df900008df8
    ;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         0;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar10);
    pTVar12 = (TestNode *)operator_new(0x88);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"array_buffer_binding","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar11->m_testCtx,(char *)local_108,"ARRAY_BUFFER_BINDING");
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar11;
    *(undefined4 *)&pTVar12[1].m_testCtx = uVar1;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216b000;
    *(undefined8 *)((long)&pTVar12[1].m_testCtx + 4) = 0x889200008894;
    tcu::TestNode::addChild((TestNode *)local_c8,pTVar12);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  lVar10 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar10);
    pTVar12 = (TestNode *)operator_new(0x88);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"element_array_buffer_binding","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar11->m_testCtx,(char *)local_108,
               "ELEMENT_ARRAY_BUFFER_BINDING");
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar11;
    *(undefined4 *)&pTVar12[1].m_testCtx = uVar1;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216b000;
    *(undefined8 *)((long)&pTVar12[1].m_testCtx + 4) = 0x889300008895;
    tcu::TestNode::addChild((TestNode *)local_c8,pTVar12);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  lVar10 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar10);
    pTVar12 = (TestNode *)operator_new(0x80);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"current_program_binding","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar11->m_testCtx,(char *)local_108,"CURRENT_PROGRAM");
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar11;
    *(undefined4 *)&pTVar12[1].m_testCtx = uVar1;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216b0b0;
    tcu::TestNode::addChild((TestNode *)local_c8,pTVar12);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"stencil_clear_value","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"STENCIL_CLEAR_VALUE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b108;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"active_texture","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,"ACTIVE_TEXTURE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b160;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar10);
    pTVar12 = (TestNode *)operator_new(0x80);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"renderbuffer_binding","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar11->m_testCtx,(char *)local_108,"RENDERBUFFER_BINDING");
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar11;
    *(undefined4 *)&pTVar12[1].m_testCtx = uVar1;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216b1b8;
    tcu::TestNode::addChild((TestNode *)local_c8,pTVar12);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  lVar10 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar10);
    pTVar12 = (TestNode *)operator_new(0x88);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"texture_binding_2d","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar11->m_testCtx,(char *)local_108,"TEXTURE_BINDING_2D");
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar11;
    *(undefined4 *)&pTVar12[1].m_testCtx = uVar1;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216b210;
    *(undefined8 *)((long)&pTVar12[1].m_testCtx + 4) = 0xde100008069;
    tcu::TestNode::addChild((TestNode *)local_c8,pTVar12);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  lVar10 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar10);
    pTVar12 = (TestNode *)operator_new(0x88);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"texture_binding_cube_map","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar11->m_testCtx,(char *)local_108,"TEXTURE_BINDING_CUBE_MAP");
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar11;
    *(undefined4 *)&pTVar12[1].m_testCtx = uVar1;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216b210;
    *(undefined8 *)((long)&pTVar12[1].m_testCtx + 4) = 0x851300008514;
    tcu::TestNode::addChild((TestNode *)local_c8,pTVar12);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  lVar10 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar10);
    pTVar12 = (TestNode *)operator_new(0x80);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"framebuffer_binding","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar11->m_testCtx,(char *)local_108,
               "DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING");
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar11;
    *(undefined4 *)&pTVar12[1].m_testCtx = uVar1;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216b268;
    tcu::TestNode::addChild((TestNode *)local_c8,pTVar12);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  lVar10 = 0;
  do {
    pGVar5 = (&local_98)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar11 = (local_c8->super_TestCaseGroup).m_context;
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"implementation_color_read","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108 = &local_f8;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_f8 = *plVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *plVar13;
      local_108 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar11,(char *)local_108,
                     "IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b2c0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
    tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pAVar8);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    plVar9 = &local_d8;
    if (local_e8 != plVar9) {
      operator_delete(local_e8,local_d8 + 1);
      plVar9 = extraout_RAX;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  return (int)plVar9;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	static const QueryType queryTypes[] =
	{
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_FLOAT,
	};

	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLint			value;
	} implementationMinLimits[] =
	{
		{ "subpixel_bits",						"SUBPIXEL_BITS has  a minimum value of 4",						GL_SUBPIXEL_BITS,						4	},
		{ "max_texture_size",					"MAX_TEXTURE_SIZE has  a minimum value of 64",					GL_MAX_TEXTURE_SIZE,					64	},
		{ "max_cube_map_texture_size",			"MAX_CUBE_MAP_TEXTURE_SIZE has  a minimum value of 16",			GL_MAX_CUBE_MAP_TEXTURE_SIZE,			16	},
		{ "max_vertex_attribs",					"MAX_VERTEX_ATTRIBS has  a minimum value of 8",					GL_MAX_VERTEX_ATTRIBS,					8	},
		{ "max_vertex_uniform_vectors",			"MAX_VERTEX_UNIFORM_VECTORS has  a minimum value of 128",		GL_MAX_VERTEX_UNIFORM_VECTORS,			128	},
		{ "max_varying_vectors",				"MAX_VARYING_VECTORS has  a minimum value of 8",				GL_MAX_VARYING_VECTORS,					8	},
		{ "max_combined_texture_image_units",	"MAX_COMBINED_TEXTURE_IMAGE_UNITS has  a minimum value of 8",	GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,	8	},
		{ "max_vertex_texture_image_units",		"MAX_VERTEX_TEXTURE_IMAGE_UNITS has  a minimum value of 0",		GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,		0	},
		{ "max_texture_image_units",			"MAX_TEXTURE_IMAGE_UNITS has  a minimum value of 8",			GL_MAX_TEXTURE_IMAGE_UNITS,				8	},
		{ "max_fragment_uniform_vectors",		"MAX_FRAGMENT_UNIFORM_VECTORS has  a minimum value of 16",		GL_MAX_FRAGMENT_UNIFORM_VECTORS,		16	},
		{ "max_renderbuffer_size",				"MAX_RENDERBUFFER_SIZE has  a minimum value of 1",				GL_MAX_RENDERBUFFER_SIZE,				1	},
	};

	// \note implementation defined limits have their own tests so just check the conversions to boolean and float
	StateVerifier* implementationLimitVerifiers[]	= {m_verifierBoolean,						m_verifierFloat};
	StateVerifier* normalVerifiers[]				= {m_verifierBoolean,	m_verifierInteger,	m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMinLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMinimumValueTestCase(m_context, verifier, (std::string(implementationMinLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMinLimits[testNdx].description, implementationMinLimits[testNdx].targetName, implementationMinLimits[testNdx].value)));

	FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new SampleBuffersTestCase		(m_context,	 verifier, (std::string("sample_buffers")						+ verifier->getTestNamePostfix()).c_str(),		"SAMPLE_BUFFERS")));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SamplesTestCase				(m_context,	 verifier, (std::string("samples")								+ verifier->getTestNamePostfix()).c_str(),		"SAMPLES")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("generate_mipmap_hint")					+ verifier->getTestNamePostfix()).c_str(),		"GENERATE_MIPMAP_HINT",				GL_GENERATE_MIPMAP_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthFuncTestCase			(m_context,	 verifier, (std::string("depth_func")							+ verifier->getTestNamePostfix()).c_str(),		"DEPTH_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new CullFaceTestCase			(m_context,	 verifier, (std::string("cull_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"CULL_FACE_MODE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new FrontFaceTestCase			(m_context,	 verifier, (std::string("front_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"FRONT_FACE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ViewPortTestCase			(m_context,	 verifier, (std::string("viewport")								+ verifier->getTestNamePostfix()).c_str(),		"VIEWPORT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ScissorBoxTestCase			(m_context,	 verifier, (std::string("scissor_box")							+ verifier->getTestNamePostfix()).c_str(),		"SCISSOR_BOX")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new MaxViewportDimsTestCase		(m_context,	 verifier, (std::string("max_viewport_dims")					+ verifier->getTestNamePostfix()).c_str(),		"MAX_VIEWPORT_DIMS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new BufferComponentSizeCase		(m_context,	 verifier, (std::string("buffer_component_size")				+ verifier->getTestNamePostfix()).c_str(),		"x BITS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_ref")							+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF",						GL_STENCIL_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_back_ref")						+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF",					GL_STENCIL_BACK_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate")					+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate_both")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate_both")		+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_FRONT_AND_BACK)));

	const struct NamedStencilOp
	{
		const char*		name;

		const char*		frontDescription;
		GLenum			frontTarget;
		const char*		backDescription;
		GLenum			backTarget;
	} stencilOps[] =
	{
		{ "fail",		"STENCIL_FAIL",				GL_STENCIL_FAIL,			"STENCIL_BACK_FAIL",			GL_STENCIL_BACK_FAIL			},
		{ "depth_fail",	"STENCIL_PASS_DEPTH_FAIL",	GL_STENCIL_PASS_DEPTH_FAIL,	"STENCIL_BACK_PASS_DEPTH_FAIL",	GL_STENCIL_BACK_PASS_DEPTH_FAIL	},
		{ "depth_pass",	"STENCIL_PASS_DEPTH_PASS",	GL_STENCIL_PASS_DEPTH_PASS,	"STENCIL_BACK_PASS_DEPTH_PASS",	GL_STENCIL_BACK_PASS_DEPTH_PASS	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(stencilOps); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,	stencilOps[testNdx].backTarget)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT_AND_BACK)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_FRONT_AND_BACK)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_BACK)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncTestCase					(m_context, verifier,	(std::string("stencil_func")								+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate_both")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_value_mask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK",					GL_STENCIL_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_back_value_mask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK",				GL_STENCIL_BACK_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate_both")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_writemask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK",					GL_STENCIL_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_back_writemask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK",				GL_STENCIL_BACK_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_FRONT_AND_BACK)));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("unpack_alignment")	+ verifier->getTestNamePostfix()).c_str(),	"UNPACK_ALIGNMENT",	GL_UNPACK_ALIGNMENT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("pack_alignment")		+ verifier->getTestNamePostfix()).c_str(),	"PACK_ALIGNMENT",	GL_PACK_ALIGNMENT)));

	{
		const struct BlendColorState
		{
			const char*	name;
			const char*	description;
			GLenum		target;
			int			initialValue;
		} blendColorStates[] =
		{
			{ "blend_src_rgb",		"BLEND_SRC_RGB",	GL_BLEND_SRC_RGB,		GL_ONE	},
			{ "blend_src_alpha",	"BLEND_SRC_ALPHA",	GL_BLEND_SRC_ALPHA,		GL_ONE	},
			{ "blend_dst_rgb",		"BLEND_DST_RGB",	GL_BLEND_DST_RGB,		GL_ZERO	},
			{ "blend_dst_alpha",	"BLEND_DST_ALPHA",	GL_BLEND_DST_ALPHA,		GL_ZERO	}
		};
		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendColorStates); testNdx++)
		{
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncTestCase			(m_context, verifier, (std::string(blendColorStates[testNdx].name)					+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncSeparateTestCase	(m_context, verifier, (std::string(blendColorStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
		}
	}

	{
		const struct BlendEquationState
		{
			const char*	name;
			const char*	description;
			GLenum		target;
			int			initialValue;
		} blendEquationStates[] =
		{
			{ "blend_equation_rgb",		"BLEND_EQUATION_RGB",	GL_BLEND_EQUATION_RGB,		GL_FUNC_ADD	},
			{ "blend_equation_alpha",	"BLEND_EQUATION_ALPHA",	GL_BLEND_EQUATION_ALPHA,	GL_FUNC_ADD	}
		};
		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendEquationStates); testNdx++)
		{
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationTestCase			(m_context, verifier, (std::string(blendEquationStates[testNdx].name) +				+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationSeparateTestCase	(m_context, verifier, (std::string(blendEquationStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
		}
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase			(m_context, verifier, (std::string("compressed_texture_formats")	+ verifier->getTestNamePostfix()).c_str(),	"COMPRESSED_TEXTURE_FORMATS",	GL_COMPRESSED_TEXTURE_FORMATS,		GL_NUM_COMPRESSED_TEXTURE_FORMATS,	0)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase			(m_context, verifier, (std::string("shader_binary_formats")			+ verifier->getTestNamePostfix()).c_str(),	"SHADER_BINARY_FORMATS",		GL_SHADER_BINARY_FORMATS,			GL_NUM_SHADER_BINARY_FORMATS,		0)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new BufferBindingTestCase				(m_context, queryType, (std::string("array_buffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"ARRAY_BUFFER_BINDING",			GL_ARRAY_BUFFER_BINDING,			GL_ARRAY_BUFFER)));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new BufferBindingTestCase				(m_context, queryType, (std::string("element_array_buffer_binding")	+ getQueryTypeSuffix(queryType)).c_str(),	"ELEMENT_ARRAY_BUFFER_BINDING",	GL_ELEMENT_ARRAY_BUFFER_BINDING,	GL_ELEMENT_ARRAY_BUFFER)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new CurrentProgramBindingTestCase		(m_context, queryType, (std::string("current_program_binding")		+ getQueryTypeSuffix(queryType)).c_str(),	"CURRENT_PROGRAM")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilClearValueTestCase			(m_context, verifier, (std::string("stencil_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ActiveTextureTestCase				(m_context, verifier, (std::string("active_texture")				+ verifier->getTestNamePostfix()).c_str(),	"ACTIVE_TEXTURE")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new RenderbufferBindingTestCase			(m_context, queryType, (std::string("renderbuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"RENDERBUFFER_BINDING")));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TextureBindingTestCase				(m_context, queryType, (std::string("texture_binding_2d")			+ getQueryTypeSuffix(queryType)).c_str(),	"TEXTURE_BINDING_2D",			GL_TEXTURE_BINDING_2D,			GL_TEXTURE_2D)));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TextureBindingTestCase				(m_context, queryType, (std::string("texture_binding_cube_map")		+ getQueryTypeSuffix(queryType)).c_str(),	"TEXTURE_BINDING_CUBE_MAP",		GL_TEXTURE_BINDING_CUBE_MAP,	GL_TEXTURE_CUBE_MAP)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new FrameBufferBindingTestCase			(m_context, queryType, (std::string("framebuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationColorReadTestCase		(m_context, verifier, (std::string("implementation_color_read")		+ verifier->getTestNamePostfix()).c_str(),	"IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT")));
}